

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_math.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  ostream *poVar9;
  double *pdVar10;
  int i_2;
  ulong uVar11;
  int j;
  long lVar12;
  Mat4x4 *pMVar13;
  Mat4x4 *pMVar14;
  int i;
  long lVar15;
  int j_1;
  double (*__return_storage_ptr__) [4];
  bool bVar16;
  Mat4x4 tm;
  Mat4x4 prod;
  Mat4x4 local_238;
  double local_1b0 [48];
  
  pMVar14 = &local_238;
  pMVar13 = &local_238;
  local_238.d[0][0] = 11.0;
  local_238.d[0][1] = 10.0;
  local_238.d[0][2] = 4.0;
  local_238.d[0][3] = 6.0;
  local_238.d[1][0] = 9.0;
  local_238.d[1][1] = 8.0;
  local_238.d[1][2] = 7.0;
  local_238.d[1][3] = 12.0;
  local_238.d[2][0] = 13.0;
  local_238.d[2][1] = 14.0;
  local_238.d[2][2] = 15.0;
  local_238.d[2][3] = 16.0;
  local_238.d[3][0] = 17.0;
  local_238.d[3][1] = 3.0;
  local_238.d[3][2] = 5.0;
  local_238.d[3][3] = 18.0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"M:\n",3);
  lVar15 = 0;
  while( true ) {
    lVar12 = 0;
    do {
      poVar9 = std::ostream::_M_insert<double>(*(double *)((long)pMVar14 + lVar12 * 8));
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    std::ostream::_M_insert<double>(local_238.d[lVar15][3]);
    if (lVar15 == 3) break;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    lVar15 = lVar15 + 1;
    pMVar14 = (Mat4x4 *)((long)pMVar14 + 0x20);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  __return_storage_ptr__ = (double (*) [4])local_1b0;
  phyr::_Mat4x4::inverse((Mat4x4 *)__return_storage_ptr__,&local_238);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nInverse M:\n",0xc);
  lVar15 = 0;
  while( true ) {
    lVar12 = 0;
    do {
      poVar9 = std::ostream::_M_insert<double>((*(double (*) [4])*__return_storage_ptr__)[lVar12]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    std::ostream::_M_insert<double>(local_1b0[lVar15 * 4 + 3]);
    if (lVar15 == 3) break;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    lVar15 = lVar15 + 1;
    __return_storage_ptr__ = __return_storage_ptr__ + 1;
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  pdVar10 = local_1b0 + 0x10;
  local_1b0[0x1f] = 1.0;
  local_1b0[0x1a] = 1.0;
  local_1b0[0x15] = 1.0;
  local_1b0[0x10] = 1.0;
  local_1b0[0x11] = 0.0;
  local_1b0[0x12] = 0.0;
  local_1b0[0x13] = 0.0;
  local_1b0[0x14] = 0.0;
  local_1b0[0x16] = 0.0;
  local_1b0[0x17] = 0.0;
  local_1b0[0x18] = 0.0;
  local_1b0[0x19] = 0.0;
  local_1b0[0x1b] = 0.0;
  local_1b0[0x1c] = 0.0;
  local_1b0[0x1d] = 0.0;
  local_1b0[0x1e] = 0.0;
  lVar15 = 0;
  do {
    dVar1 = local_238.d[lVar15][0];
    dVar2 = local_238.d[lVar15][1];
    dVar3 = local_238.d[lVar15][2];
    dVar4 = local_238.d[lVar15][3];
    lVar12 = 0;
    do {
      dVar5 = local_1b0[lVar12 + 1];
      dVar6 = local_1b0[lVar12 + 5];
      dVar7 = local_1b0[lVar12 + 9];
      dVar8 = local_1b0[lVar12 + 0xd];
      pdVar10[lVar12] =
           local_1b0[lVar12 + 0xc] * dVar4 +
           local_1b0[lVar12 + 8] * dVar3 + local_1b0[lVar12 + 4] * dVar2 + local_1b0[lVar12] * dVar1
      ;
      (pdVar10 + lVar12)[1] = dVar8 * dVar4 + dVar7 * dVar3 + dVar6 * dVar2 + dVar5 * dVar1;
      lVar12 = lVar12 + 2;
    } while (lVar12 != 4);
    lVar15 = lVar15 + 1;
    pdVar10 = pdVar10 + 4;
  } while (lVar15 != 4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nProduct:\n",10);
  *(uint *)(_ITM_deregisterTMCloneTable + *(long *)(std::cout + -0x18)) =
       *(uint *)(_ITM_deregisterTMCloneTable + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  pdVar10 = local_1b0 + 0x10;
  lVar15 = 0;
  while( true ) {
    lVar12 = 0;
    do {
      poVar9 = std::ostream::_M_insert<double>(pdVar10[lVar12]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    std::ostream::_M_insert<double>(local_1b0[lVar15 * 4 + 0x13]);
    if (lVar15 == 3) break;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    lVar15 = lVar15 + 1;
    pdVar10 = pdVar10 + 4;
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  pdVar10 = local_1b0 + 0x20;
  local_1b0[0x2f] = 1.0;
  local_1b0[0x2a] = 1.0;
  local_1b0[0x25] = 1.0;
  local_1b0[0x20] = 1.0;
  local_1b0[0x21] = 0.0;
  local_1b0[0x22] = 0.0;
  local_1b0[0x23] = 0.0;
  local_1b0[0x24] = 0.0;
  local_1b0[0x26] = 0.0;
  local_1b0[0x27] = 0.0;
  local_1b0[0x28] = 0.0;
  local_1b0[0x29] = 0.0;
  local_1b0[0x2b] = 0.0;
  local_1b0[0x2c] = 0.0;
  local_1b0[0x2d] = 0.0;
  local_1b0[0x2e] = 0.0;
  uVar11 = 0;
  bVar16 = false;
  do {
    lVar15 = 0;
    do {
      if ((*(double *)((long)pMVar13 + lVar15 * 8) != pdVar10[lVar15]) ||
         (NAN(*(double *)((long)pMVar13 + lVar15 * 8)) || NAN(pdVar10[lVar15]))) {
        return (byte)~bVar16 & 1;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 4);
    bVar16 = 2 < uVar11;
    uVar11 = uVar11 + 1;
    pdVar10 = pdVar10 + 4;
    pMVar13 = (Mat4x4 *)((long)pMVar13 + 0x20);
    if (uVar11 == 4) {
      return 0;
    }
  } while( true );
}

Assistant:

int main(int argc, const char* argv[]) {
    phyr::Mat4x4 m(11, 10, 4, 6, 9, 8, 7, 12,
                   13, 14, 15, 16, 17, 3, 5, 18);
    std::cout << "M:\n";
    std::cout << m << std::endl;

    phyr::Mat4x4 tm = phyr::Mat4x4::inverse(m);
    std::cout << "\nInverse M:\n";
    std::cout << tm << std::endl;

    phyr::Mat4x4 prod = m * tm;
    std::cout << "\nProduct:\n";
    std::cout << std::fixed << prod << std::endl;

    return m == phyr::Mat4x4() ? 0 : 1;
}